

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O1

void __thiscall prevector_tests::prevector_tester<8U,_int>::test(prevector_tester<8U,_int> *this)

{
  pretype *other;
  long lVar1;
  int *piVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  pretype *ppVar6;
  char *pcVar7;
  long lVar8;
  iterator first_00;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  pretype *__range2;
  long in_FS_OFFSET;
  bool bVar13;
  DataStream local_78;
  VectorFormatter<DefaultFormatter> local_49;
  direct_or_indirect local_48;
  uint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  other = &this->pre_vector;
  first._M_current =
       (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  last._M_current =
       (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar4 = (this->pre_vector)._size;
  uVar5 = (long)last._M_current - (long)first._M_current >> 2;
  uVar3 = uVar4 - 9;
  if (uVar4 < 9) {
    uVar3 = uVar4;
  }
  this->passed = (bool)((uVar3 != 0) != ((long)last._M_current - (long)first._M_current == 0) &
                       uVar5 == uVar3 & this->passed);
  if (last._M_current != first._M_current) {
    ppVar6 = other;
    if (8 < uVar4) {
      ppVar6 = (pretype *)(this->pre_vector)._union.indirect_contents.indirect;
    }
    piVar10 = (int *)((long)ppVar6 + (uVar5 & 0xffffffff) * -4 + (long)(int)uVar3 * 4);
    bVar13 = this->passed != false;
    uVar11 = 0;
    do {
      piVar2 = (int *)((long)&ppVar6->_union + (long)(int)uVar11 * 4);
      bVar13 = (bool)(piVar10 == piVar2 & uVar11 == (long)(int)uVar11 & bVar13 &
                     first._M_current[uVar11] == *piVar2);
      uVar11 = uVar11 + 1;
      piVar10 = piVar10 + 1;
    } while ((uVar11 & 0xffffffff) < uVar5);
    this->passed = bVar13;
  }
  prevector<8U,_int,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
            ((prevector<8U,_int,_unsigned_int,_int> *)&local_48.indirect_contents,first,last);
  bVar13 = prevector<8U,_int,_unsigned_int,_int>::operator==
                     ((prevector<8U,_int,_unsigned_int,_int> *)&local_48.indirect_contents,other);
  this->passed = (bool)(this->passed & bVar13);
  if (8 < local_28) {
    free(local_48.indirect_contents.indirect);
    local_48.indirect_contents.indirect = (char *)0x0;
  }
  uVar4 = (this->pre_vector)._size;
  first_00.ptr = (int *)other;
  if (8 < uVar4) {
    first_00.ptr = (int *)(this->pre_vector)._union.indirect_contents.indirect;
    uVar4 = uVar4 - 9;
  }
  prevector<8U,_int,_unsigned_int,_int>::prevector<prevector<8U,_int,_unsigned_int,_int>::iterator>
            ((prevector<8U,_int,_unsigned_int,_int> *)&local_48.indirect_contents,first_00,
             (iterator)(first_00.ptr + (int)uVar4));
  bVar13 = prevector<8U,_int,_unsigned_int,_int>::operator==
                     ((prevector<8U,_int,_unsigned_int,_int> *)&local_48.indirect_contents,other);
  this->passed = (bool)(this->passed & bVar13);
  if (8 < local_28) {
    free(local_48.indirect_contents.indirect);
  }
  uVar4 = (this->pre_vector)._size;
  ppVar6 = other;
  if (8 < uVar4) {
    ppVar6 = (pretype *)(this->pre_vector)._union.indirect_contents.indirect;
    uVar4 = uVar4 - 9;
  }
  lVar8 = (long)(int)uVar4;
  if (uVar4 == 0) {
    lVar9 = 0;
  }
  else {
    bVar13 = this->passed != false;
    lVar12 = lVar8 * 4;
    lVar9 = 0;
    do {
      lVar1 = lVar9 * 4;
      piVar10 = (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9;
      lVar9 = lVar9 + 1;
      bVar13 = (bool)(bVar13 & *(int *)((long)&ppVar6->_union + lVar1) == *piVar10);
      lVar12 = lVar12 + -4;
    } while (lVar12 != 0);
    this->passed = bVar13;
  }
  if (uVar4 != 0) {
    bVar13 = this->passed != false;
    lVar12 = lVar8 * 4;
    do {
      lVar1 = lVar9 + -1;
      lVar9 = lVar9 + -1;
      bVar13 = (bool)(bVar13 & *(int *)((long)ppVar6 + lVar12 + -4) ==
                               (this->real_vector).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar1]);
      lVar12 = lVar12 + -4;
    } while (lVar12 != 0);
    this->passed = bVar13;
  }
  if (uVar4 != 0) {
    bVar13 = this->passed != false;
    lVar12 = 0;
    do {
      piVar10 = (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + lVar9;
      lVar9 = lVar9 + 1;
      bVar13 = (bool)(bVar13 & *(int *)((long)&ppVar6->_union + lVar12) == *piVar10);
      lVar12 = lVar12 + 4;
    } while (lVar8 * 4 - lVar12 != 0);
    this->passed = bVar13;
  }
  if (uVar4 != 0) {
    bVar13 = this->passed != false;
    lVar12 = 0;
    do {
      bVar13 = (bool)(bVar13 & *(int *)((long)ppVar6 + lVar12 + lVar8 * 4 + -4) ==
                               *(int *)((long)(this->real_vector).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start +
                                       lVar12 + lVar9 * 4 + -4));
      lVar12 = lVar12 + -4;
    } while (-lVar12 != lVar8 * 4);
    this->passed = bVar13;
  }
  local_48._16_8_ = 0;
  local_48._24_8_ = 0;
  local_48.indirect_contents.indirect = (char *)0x0;
  local_48._8_8_ = (char *)0x0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_read_pos = 0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  VectorFormatter<DefaultFormatter>::Ser<DataStream,std::vector<int,std::allocator<int>>>
            (&local_49,(DataStream *)&local_48.indirect_contents,&this->real_vector);
  VectorFormatter<DefaultFormatter>::Ser<DataStream,prevector<8u,int,unsigned_int,int>>
            (&local_49,&local_78,other);
  pcVar7 = local_48.indirect_contents.indirect + local_48._24_8_;
  this->passed = (bool)(this->passed &
                       local_48._8_8_ - (long)pcVar7 ==
                       (long)local_78.vch.
                             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_78.vch.
                              super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos));
  if ((char *)local_48._8_8_ != pcVar7) {
    bVar13 = this->passed != false;
    uVar5 = 0;
    do {
      bVar13 = (bool)(bVar13 & pcVar7[uVar5] ==
                               (local_78.vch.
                                super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos)
                               [uVar5]);
      this->passed = bVar13;
      uVar5 = uVar5 + 1;
    } while ((uVar5 & 0xffffffff) < (ulong)(local_48._8_8_ - (long)pcVar7));
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_78);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
             &local_48.indirect_contents);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void test() {
        const pretype& const_pre_vector = pre_vector;
        local_check_equal(real_vector.size(), pre_vector.size());
        local_check_equal(real_vector.empty(), pre_vector.empty());
        for (Size s = 0; s < real_vector.size(); s++) {
             local_check(real_vector[s] == pre_vector[s]);
             local_check(&(pre_vector[s]) == &(pre_vector.begin()[s]));
             local_check(&(pre_vector[s]) == &*(pre_vector.begin() + s));
             local_check(&(pre_vector[s]) == &*((pre_vector.end() + s) - real_vector.size()));
        }
        // local_check(realtype(pre_vector) == real_vector);
        local_check(pretype(real_vector.begin(), real_vector.end()) == pre_vector);
        local_check(pretype(pre_vector.begin(), pre_vector.end()) == pre_vector);
        size_t pos = 0;
        for (const T& v : pre_vector) {
             local_check(v == real_vector[pos++]);
        }
        for (const T& v : pre_vector | std::views::reverse) {
            local_check(v == real_vector[--pos]);
        }
        for (const T& v : const_pre_vector) {
             local_check(v == real_vector[pos++]);
        }
        for (const T& v : const_pre_vector | std::views::reverse) {
            local_check(v == real_vector[--pos]);
        }
        DataStream ss1{};
        DataStream ss2{};
        ss1 << real_vector;
        ss2 << pre_vector;
        local_check_equal(ss1.size(), ss2.size());
        for (Size s = 0; s < ss1.size(); s++) {
            local_check_equal(ss1[s], ss2[s]);
        }
    }